

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

string * google::protobuf::compiler::objectivec::StripProto
                   (string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  bool bVar4;
  long *local_40;
  string *local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,".protodevel","");
  if ((string *)filename->_M_string_length < local_38) {
    bVar4 = false;
  }
  else {
    iVar2 = std::__cxx11::string::compare
                      ((ulong)filename,(long)filename->_M_string_length - (long)local_38,local_38);
    bVar4 = iVar2 == 0;
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (bVar4) {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,".protodevel","");
    psVar3 = (string *)filename->_M_string_length;
    if (local_38 <= psVar3) {
      iVar2 = std::__cxx11::string::compare((ulong)filename,(long)psVar3 - (long)local_38,local_38);
      psVar3 = (string *)filename->_M_string_length;
      if (iVar2 == 0) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
        goto LAB_0022d7c2;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (filename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,psVar3 + (long)pcVar1);
  }
  else {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,".proto","");
    psVar3 = (string *)filename->_M_string_length;
    if (local_38 <= psVar3) {
      iVar2 = std::__cxx11::string::compare((ulong)filename,(long)psVar3 - (long)local_38,local_38);
      psVar3 = (string *)filename->_M_string_length;
      if (iVar2 == 0) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
        goto LAB_0022d7c2;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (filename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,psVar3 + (long)pcVar1);
  }
LAB_0022d7c2:
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string StripProto(const string& filename) {
  if (HasSuffixString(filename, ".protodevel")) {
    return StripSuffixString(filename, ".protodevel");
  } else {
    return StripSuffixString(filename, ".proto");
  }
}